

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::RepeatedFieldHelper<16>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  long *plVar1;
  long *plVar2;
  int i;
  int index;
  
  for (index = 0; index < *field; index = index + 1) {
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    plVar2 = RepeatedField<long>::Get((RepeatedField<long> *)field,index);
    plVar1 = (long *)output->ptr;
    *plVar1 = *plVar2;
    output->ptr = (uint8_t *)(plVar1 + 1);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }